

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Common.cpp
# Opt level: O0

grid * idx2::GetGrid(grid *__return_storage_ptr__,idx2_file *Idx2,extent *Ext)

{
  u64 uVar1;
  uint uVar2;
  extent eVar3;
  int local_740;
  int iStack_73c;
  int local_730;
  int iStack_72c;
  uint local_724;
  uint uStack_720;
  int local_6f8;
  int iStack_6f4;
  int local_698;
  int iStack_694;
  int local_688;
  int iStack_684;
  int local_678;
  int iStack_674;
  int local_648;
  int iStack_644;
  v3i Last3;
  uint local_628;
  uint uStack_624;
  v3i First3;
  uint local_614;
  int D;
  v3i Strd3;
  u64 local_5f8;
  extent CroppedExt;
  extent *Ext_local;
  idx2_file *Idx2_local;
  int local_5a4;
  int iStack_5a0;
  int local_574;
  int iStack_570;
  int local_544;
  int iStack_540;
  int local_514;
  int iStack_510;
  int local_4e4;
  int iStack_4e0;
  int local_470;
  int iStack_46c;
  int local_424;
  int iStack_420;
  int local_3f4;
  int iStack_3f0;
  int local_394;
  int iStack_390;
  int local_364;
  int iStack_360;
  int local_334;
  int iStack_330;
  int local_1d0;
  int iStack_1cc;
  int local_1b0;
  int iStack_1ac;
  int local_130;
  int iStack_12c;
  int local_c0;
  int iStack_bc;
  int local_88;
  int iStack_84;
  int local_50;
  int iStack_4c;
  
  uVar1 = local_5f8;
  Strd3.field_0.field_4.YZ.field_0 = (v2<int>)(anon_union_8_4_6ba14846_for_v2<int>_1)0x0;
  eVar3 = Crop<idx2::extent,idx2::extent>
                    (Ext,(extent *)((long)&Strd3.field_0.field_3.XY.field_0 + 4));
  local_614 = 1;
  D = 1;
  Strd3.field_0.field_0.X = 1;
  First3.field_0.field_0.Z = 0;
  while( true ) {
    if (First3.field_0.field_0.Z == 3) {
      local_5f8 = eVar3.From;
      local_50 = ((int)eVar3.From << 0xb) >> 0xb;
      iStack_4c = (int)((long)(local_5f8 << 0x16) >> 0x2b);
      local_88 = ((int)eVar3.From << 0xb) >> 0xb;
      iStack_84 = (int)((long)(local_5f8 << 0x16) >> 0x2b);
      local_c0 = ((int)uVar1 << 0xb) >> 0xb;
      iStack_bc = (int)((long)(uVar1 << 0x16) >> 0x2b);
      local_1b0 = (int)_local_88;
      iStack_1ac = (int)((ulong)_local_88 >> 0x20);
      local_1d0 = (int)_local_c0;
      iStack_1cc = (int)((ulong)_local_c0 >> 0x20);
      local_130 = local_1b0 + local_1d0;
      iStack_12c = iStack_1ac + iStack_1cc;
      local_470 = (int)_local_130;
      iStack_46c = (int)((ulong)_local_130 >> 0x20);
      local_394 = local_470 + -1;
      iStack_390 = iStack_46c + -1;
      local_648 = (int)_local_394;
      iStack_644 = (int)((ulong)_local_394 >> 0x20);
      local_334 = local_648 + local_614;
      iStack_330 = iStack_644 + D;
      local_698 = (int)_local_334;
      iStack_694 = (int)((ulong)_local_334 >> 0x20);
      local_364 = local_698 + -1;
      iStack_360 = iStack_694 + -1;
      local_688 = (int)_local_364;
      iStack_684 = (int)((ulong)_local_364 >> 0x20);
      local_4e4 = local_688 / (int)local_614;
      iStack_4e0 = iStack_684 / D;
      local_678 = (int)_local_4e4;
      iStack_674 = (int)((ulong)_local_4e4 >> 0x20);
      local_574 = local_678 * local_614;
      iStack_570 = iStack_674 * D;
      local_628 = (uint)_local_50;
      uStack_624 = (uint)((ulong)_local_50 >> 0x20);
      local_514 = (int)local_628 / (int)local_614;
      iStack_510 = (int)uStack_624 / D;
      local_6f8 = (int)_local_514;
      iStack_6f4 = (int)((ulong)_local_514 >> 0x20);
      uVar2 = ((int)((long)(local_5f8 * 2) >> 0x2b) / Strd3.field_0.field_0.X) *
              Strd3.field_0.field_0.X;
      local_5a4 = local_6f8 * local_614;
      iStack_5a0 = iStack_6f4 * D;
      local_648 = (int)_local_574;
      iStack_644 = (int)((ulong)_local_574 >> 0x20);
      local_628 = (uint)_local_5a4;
      uStack_624 = (uint)((ulong)_local_5a4 >> 0x20);
      local_3f4 = local_648 - local_628;
      iStack_3f0 = iStack_644 - uStack_624;
      local_740 = (int)_local_3f4;
      iStack_73c = (int)((ulong)_local_3f4 >> 0x20);
      local_544 = local_740 / (int)local_614;
      iStack_540 = iStack_73c / D;
      local_730 = (int)_local_544;
      iStack_72c = (int)((ulong)_local_544 >> 0x20);
      local_424 = local_730 + 1;
      iStack_420 = iStack_72c + 1;
      (__return_storage_ptr__->super_extent).From =
           (long)(int)(local_628 & 0x1fffff) + (long)(int)(uStack_624 & 0x1fffff) * 0x200000 +
           ((long)(int)(uVar2 & 0x1fffff) << 0x2a);
      local_724 = (uint)_local_424;
      uStack_720 = (uint)((ulong)_local_424 >> 0x20);
      (__return_storage_ptr__->super_extent).Dims =
           (long)(int)(local_724 & 0x1fffff) + (long)(int)(uStack_720 & 0x1fffff) * 0x200000 +
           ((long)(int)((int)((((int)((long)(local_5f8 * 2) >> 0x2b) +
                                (int)((long)(uVar1 * 2) >> 0x2b) + Strd3.field_0.field_0.X + -2) /
                              Strd3.field_0.field_0.X) * Strd3.field_0.field_0.X - uVar2) /
                        Strd3.field_0.field_0.X + 1U & 0x1fffff) << 0x2a);
      __return_storage_ptr__->Strd =
           (long)(int)(local_614 & 0x1fffff) + (long)(int)(D & 0x1fffff) * 0x200000 +
           ((long)(int)(Strd3.field_0.field_0.X & 0x1fffff) << 0x2a);
      return __return_storage_ptr__;
    }
    if (2 < First3.field_0.field_0.Z) break;
    if (2 < First3.field_0.field_0.Z) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    (&local_614)[First3.field_0.field_0.Z] =
         (&local_614)[First3.field_0.field_0.Z] <<
         ((byte)(((v3i *)(&Idx2->DecodeSubbandMasks + -4))->field_0).E[First3.field_0.field_0.Z] &
         0x1f);
    First3.field_0.field_0.Z = First3.field_0.field_0.Z + 1;
  }
  __assert_fail("Idx < 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
}

Assistant:

grid
GetGrid(const idx2_file& Idx2, const extent& Ext)
{
  auto CroppedExt = Crop(Ext, extent(Idx2.Dims3));
  v3i Strd3(1); // start with stride (1, 1, 1)
  idx2_For (int, D, 0, 3)
    Strd3[D] <<= Idx2.DownsamplingFactor3[D];

  v3i First3 = From(CroppedExt);
  v3i Last3 = Last(CroppedExt);
  Last3 = ((Last3 + Strd3 - 1) / Strd3) * Strd3; // move last to the right
  First3 = (First3 / Strd3) * Strd3; // move first to the left

  return grid(First3, (Last3 - First3) / Strd3 + 1, Strd3);
}


static void
ComputeExtentsForTraversal(const idx2_file& Idx2,
                           const extent& Ext,
                           i8 Level,
                           extent* ExtentInFiles,
                           extent* VolExtentInFiles)
{
  v3i B3, C3, F3, Ff3, Fl3;
  B3 = Idx2.BrickDims3 * Pow(Idx2.GroupBrick3, Level);
  C3 = Idx2.BricksPerChunk3s[Level] * B3;
  F3 = C3 * Idx2.ChunksPerFile3s[Level];

  Ff3 = From(Ext) / F3;
  Fl3 = Last(Ext) / F3;
  *ExtentInFiles  = extent(Ff3, Fl3 - Ff3 + 1);

  extent VolExt(Idx2.Dims3);
  v3i Vff3 = From(VolExt) / F3;
  v3i Vfl3 = Last(VolExt) / F3;
  *VolExtentInFiles  = extent(Vff3, Vfl3 - Vff3 + 1);
}

using traverse_callback = error<idx2_err_code>(const traverse_item&);

error<idx2_err_code>
TraverseHierarchy(u64 TraverseOrder,
                  const v3i& From3,
                  const v3i& Dims3,
                  const extent& Extent, // in units of traverse_item
                  const extent& VolExtent, // in units of traverse_item
                  traverse_callback Callback)
{
  idx2_RAII(array<traverse_item>, Stack, Reserve(&Stack, 64), Dealloc(&Stack));
  v3i Dims3Ext((int)NextPow2(Dims3.X), (int)NextPow2(Dims3.Y), (int)NextPow2(Dims3.Z));
  traverse_item Top;
  Top.From3 = From3;
  Top.To3 = From3 + Dims3Ext;
  Top.TraverseOrder = Top.PrevTraverseOrder = TraverseOrder;
  PushBack(&Stack, Top);
  while (Size(Stack) >= 0)
  {
    Top = Back(Stack);
    int FD = Top.TraverseOrder & 0x3;
    Top.TraverseOrder >>= 2;
    if (FD == 3)
    {
      if (Top.TraverseOrder == 3)
        Top.TraverseOrder = Top.PrevTraverseOrder;
      else
        Top.PrevTraverseOrder = Top.TraverseOrder;
      continue;
    }
    PopBack(&Stack);
    if (!(Top.To3 - Top.From3 == 1))
    {
      traverse_item First = Top, Second = Top;
      First.To3[FD] =
        Top.From3[FD] + (Top.To3[FD] - Top.From3[FD]) / 2;
      Second.From3[FD] =
        Top.From3[FD] + (Top.To3[FD] - Top.From3[FD]) / 2;
      extent Skip(First.From3, First.To3 - First.From3);
      //Second.NItemsBefore = First.NItemsBefore + Prod<u64>(Dims(Crop(Skip, Extent)));
      Second.ItemOrder = First.ItemOrder + Prod<i32>(Dims(Crop(Skip, VolExtent)));
      First.Address = Top.Address;
      Second.Address = Top.Address + Prod<u64>(First.To3 - First.From3);
      if (Second.From3 < To(Extent) && From(Extent) < Second.To3)
        PushBack(&Stack, Second);
      if (First.From3 < To(Extent) && From(Extent) < First.To3)
        PushBack(&Stack, First);
    }
    else
    {
      Top.LastItem = Size(Stack) == 0;
      idx2_PropagateIfError(Callback(Top));
    }
  }
}


}